

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O2

void __thiscall UnitTest1::CodeGenTest::ParserGenTest1(CodeGenTest *this)

{
  char *in_RSI;
  char *__stat_loc;
  MyErrorHandler errhandler;
  StringLogger logger;
  Grammar<unsigned_char> grammar;
  ParserEM64T<unsigned_char> parser;
  Stage1Runner runner;
  
  LoadGrammar<unsigned_char>(&grammar,in_RSI);
  asmjit::StringLogger::StringLogger(&logger);
  MyErrorHandler::MyErrorHandler((MyErrorHandler *)&errhandler.super_ErrorHandler);
  Centaurus::ParserEM64T<unsigned_char>::ParserEM64T
            (&parser,&grammar,&logger.super_Logger,&errhandler.super_ErrorHandler);
  __stat_loc = "../../datasets/citylots.json";
  Centaurus::Stage1Runner::Stage1Runner
            (&runner,"../../datasets/citylots.json",&parser.super_IParser,0x800000,8,false,false);
  Centaurus::BaseRunner::_start<Centaurus::Stage1Runner>(&runner.super_BaseRunner);
  Centaurus::BaseRunner::wait(&runner.super_BaseRunner,__stat_loc);
  Centaurus::Stage1Runner::~Stage1Runner(&runner);
  Centaurus::ParserEM64T<unsigned_char>::~ParserEM64T(&parser);
  asmjit::ErrorHandler::~ErrorHandler(&errhandler.super_ErrorHandler);
  asmjit::StringLogger::~StringLogger(&logger);
  Centaurus::Grammar<unsigned_char>::~Grammar(&grammar);
  return;
}

Assistant:

TEST_METHOD(ParserGenTest1)
    {
        using namespace Centaurus;

        Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("../../grammar/json2.cgr");

        asmjit::StringLogger logger;

        MyErrorHandler errhandler;

        ParserEM64T<unsigned char> parser(grammar, &logger, &errhandler);

#if defined(CENTAURUS_BUILD_WINDOWS)
		const char *input_path = "..\\..\\datasets\\citylots.json";
#elif defined(CENTAURUS_BUILD_LINUX)
        const char *input_path = "../../datasets/citylots.json";
#endif

        Stage1Runner runner{input_path, &parser, 8 * 1024 * 1024, 8};

		runner.start();
        runner.wait();

        //Assert::AreEqual((const void *)(json + strlen(json)), context.result);
        //Assert::IsTrue(runner.get_result() != NULL);

        //_aligned_free(json);
    }